

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm_regression.c
# Opt level: O0

void test_valids(void)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  size_t count_00;
  size_t sVar5;
  size_t used_1;
  size_t tmp_len;
  size_t max_len;
  size_t k;
  valid_code *valid_code;
  char *hex_str;
  int success;
  size_t used;
  size_t cur;
  size_t left;
  char tmp_buf [2048];
  cs_err err;
  size_t count;
  int j;
  int i;
  cs_insn *insn;
  uint64_t address;
  valid_instructions *valid;
  valid_instructions valids [1];
  
  memcpy(&valid,&DAT_002d4ae0,0x298);
  insn = (cs_insn *)0x1000;
  bVar1 = false;
  while (!bVar1) {
    address = (uint64_t)&valid;
    tmp_buf._2044_4_ = cs_open((cs_arch)valid,valid._4_4_,&handle);
    if (tmp_buf._2044_4_ == CS_ERR_OK) {
      cs_option(handle,CS_OPT_DETAIL,3);
      cs_option(handle,CS_OPT_SYNTAX,3);
      printf("\nShould be valid\n---------------\n");
      for (count._0_4_ = 0; (int)count < *(int *)(address + 0x10); count._0_4_ = (int)count + 1) {
        cur = 0x800;
        used = 0;
        puVar3 = (undefined8 *)(address + 0x18 + (long)(int)count * 0x28);
        pcVar4 = hex_string((uchar *)*puVar3,(int)puVar3[1]);
        printf("%s %s @ 0x%04x: %s\n    %s",*(undefined8 *)(address + 8),pcVar4,
               (ulong)*(uint *)(puVar3 + 2),puVar3[4],puVar3[3]);
        count_00 = cs_disasm(handle,(uint8_t *)*puVar3,puVar3[1],(ulong)*(uint *)(puVar3 + 2),0,
                             (cs_insn **)&j);
        if (count_00 == 0) {
          printf("ERROR: invalid\n");
        }
        else {
          for (max_len = 0; max_len < count_00; max_len = max_len + 1) {
            iVar2 = snprintf(tmp_buf + (used - 8),cur,"0x%lx:\t%s\t%s\n",_j[max_len].address,
                             _j[max_len].mnemonic,_j[max_len].op_str,0,0,0);
            cur = cur - (long)iVar2;
            used = (long)iVar2 + used;
            snprint_insn_detail((char *)&left,&used,&cur,_j + max_len);
          }
          tmp_len = strlen((char *)&left);
          sVar5 = strlen((char *)puVar3[3]);
          if (tmp_len < sVar5) {
            tmp_len = sVar5;
          }
          iVar2 = memcmp(&left,(void *)puVar3[3],tmp_len);
          if (iVar2 == 0) {
            printf("    SUCCESS: valid\n");
          }
          else {
            printf("    ERROR: \'\'\'\n%s\'\'\' does not match expected \'\'\'\n%s\'\'\'\n",&left,
                   puVar3[3]);
          }
          cs_free(_j,count_00);
        }
      }
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)(uint)tmp_buf._2044_4_);
    }
    bVar1 = true;
  }
  return;
}

Assistant:

static void test_valids()
{
	struct valid_instructions valids[] = {{
		CS_ARCH_ARM,
			CS_MODE_THUMB,
			"Thumb",
			3,
			{{ (unsigned char *)"\x00\xf0\x26\xe8", 4, 0x352,
				"0x352:\tblx\t#0x3a0\n"
					"\top_count: 1\n"
					"\t\toperands[0].type: IMM = 0x3a0\n",

				"thumb2 blx with misaligned immediate"
			}, { (unsigned char *)"\x05\xdd", 2, 0x1f0,
				"0x1f0:\tble\t#0x1fe\n"
					"\top_count: 1\n"
					"\t\toperands[0].type: IMM = 0x1fe\n"
					"\tCode condition: 14\n",

				"thumb b cc with thumb-aligned target"
			}, { (unsigned char *)"\xbd\xe8\xf0\x8f", 4, 0,
			 "0x0:\tpop.w\t{r4, r5, r6, r7, r8, r9, r10, r11, pc}\n"
				 "\top_count: 9\n"
				 "\t\toperands[0].type: REG = r4\n"
				 "\t\toperands[1].type: REG = r5\n"
				 "\t\toperands[2].type: REG = r6\n"
				 "\t\toperands[3].type: REG = r7\n"
				 "\t\toperands[4].type: REG = r8\n"
				 "\t\toperands[5].type: REG = r9\n"
				 "\t\toperands[6].type: REG = r10\n"
				 "\t\toperands[7].type: REG = r11\n"
				 "\t\toperands[8].type: REG = pc\n",

				"thumb2 pop that should be valid"
			},
		}
	}};

	struct valid_instructions * valid = NULL;

	uint64_t address = 0x1000;
	cs_insn *insn;
	int i;
	int j;
	size_t count;


	for (i = 0; i < sizeof(valids)/sizeof(valids[0]); i++) {
		cs_err err;

		valid = valids + i;
		err = cs_open(valid->arch, valid->mode, &handle);

		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);
		cs_option(handle, CS_OPT_SYNTAX, CS_OPT_SYNTAX_NOREGNAME);

#define _this_printf(...) \
		{ \
			size_t used = 0; \
			used = snprintf(tmp_buf + cur, left, __VA_ARGS__); \
			left -= used; \
			cur += used; \
		}
		printf("\nShould be valid\n"
				"---------------\n");

		for (j = 0; j < valid->num_valid_codes; ++j) {
			char tmp_buf[2048];
			size_t left = 2048;
			size_t cur = 0;
			size_t used = 0;
			int success = 0;
			char * hex_str = NULL;

			struct valid_code * valid_code = NULL;
			valid_code = valid->valid_codes + j;

			hex_str = hex_string(valid_code->code, valid_code->size);

			printf("%s %s @ 0x%04x: %s\n    %s", 
					valid->platform_comment, hex_str, valid_code->start_addr, 
					valid_code->comment, valid_code->expected_out);

			count = cs_disasm(handle,
					valid_code->code, valid_code->size, 
					valid_code->start_addr, 0, &insn
					);

			if (count) {
				size_t k;
				size_t max_len = 0;
				size_t tmp_len = 0;

				for (k = 0; k < count; k++) {
					_this_printf(
							"0x%"PRIx64":\t%s\t%s\n", 
							insn[k].address, insn[k].mnemonic, 
							insn[k].op_str
							);

					snprint_insn_detail(tmp_buf, &cur, &left, &insn[k]);
				}

				max_len = strlen(tmp_buf);
				tmp_len = strlen(valid_code->expected_out);
				if (tmp_len > max_len) {
					max_len = tmp_len;
				}

				if (memcmp(tmp_buf, valid_code->expected_out, max_len)) {
					printf(
						"    ERROR: '''\n%s''' does not match"
						" expected '''\n%s'''\n", 
						tmp_buf, valid_code->expected_out
					);
				} else {
					printf("    SUCCESS: valid\n");
				}

				cs_free(insn, count);

			} else {
				printf("ERROR: invalid\n");
			}
		}

		cs_close(&handle);
	}

#undef _this_prinf
}